

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_parse.c
# Opt level: O0

char * ASN1_tag2str(int tag)

{
  int tag_local;
  char *local_8;
  
  if ((tag == 0x102) || (tag_local = tag, tag == 0x10a)) {
    tag_local = tag & 0xfffffeff;
  }
  if ((tag_local < 0) || (0x1e < tag_local)) {
    local_8 = "(unknown)";
  }
  else {
    local_8 = ASN1_tag2str::tag2str[tag_local];
  }
  return local_8;
}

Assistant:

const char *ASN1_tag2str(int tag)
{
    static const char *const tag2str[] = {
        /* 0-4 */
        "EOC", "BOOLEAN", "INTEGER", "BIT STRING", "OCTET STRING",
        /* 5-9 */
        "NULL", "OBJECT", "OBJECT DESCRIPTOR", "EXTERNAL", "REAL",
        /* 10-13 */
        "ENUMERATED", "<ASN1 11>", "UTF8STRING", "<ASN1 13>",
        /* 15-17 */
        "<ASN1 14>", "<ASN1 15>", "SEQUENCE", "SET",
        /* 18-20 */
        "NUMERICSTRING", "PRINTABLESTRING", "T61STRING",
        /* 21-24 */
        "VIDEOTEXSTRING", "IA5STRING", "UTCTIME", "GENERALIZEDTIME",
        /* 25-27 */
        "GRAPHICSTRING", "VISIBLESTRING", "GENERALSTRING",
        /* 28-30 */
        "UNIVERSALSTRING", "<ASN1 29>", "BMPSTRING"
    };

    if ((tag == V_ASN1_NEG_INTEGER) || (tag == V_ASN1_NEG_ENUMERATED))
        tag &= ~0x100;

    if (tag < 0 || tag > 30)
        return "(unknown)";
    return tag2str[tag];
}